

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh_factories.cpp
# Opt level: O3

tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
* geometrycentral::surface::makeSurfaceMeshAndGeometry
            (tuple<std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *polygons,
            vector<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
            *twins,vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
                   *vertexPositions,
            vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
            *paramCoordinates)

{
  undefined8 *puVar1;
  Vector2 *pVVar2;
  pointer pvVar3;
  pointer pvVar4;
  unsigned_long uVar5;
  Vector3 *pVVar6;
  pointer pVVar7;
  double dVar8;
  size_t i;
  _Head_base<0UL,_geometrycentral::surface::SurfaceMesh_*,_false> this;
  _Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false> this_00;
  __uniq_ptr_data<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>,_true,_true>
  this_01;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  pointer pvVar12;
  size_t sVar13;
  pointer puVar14;
  size_t sVar15;
  pointer pVVar16;
  ulong uVar17;
  
  pvVar3 = (twins->
           super__Vector_base<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (twins->
           super__Vector_base<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::tuple<unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this._M_head_impl = (SurfaceMesh *)operator_new(0x308);
  if (pvVar3 == pvVar4) {
    SurfaceMesh::SurfaceMesh(this._M_head_impl,polygons);
  }
  else {
    SurfaceMesh::SurfaceMesh(this._M_head_impl,polygons,twins);
  }
  this_00._M_head_impl = (VertexPositionGeometry *)operator_new(0x1880);
  VertexPositionGeometry::VertexPositionGeometry(this_00._M_head_impl,this._M_head_impl);
  sVar13 = (this._M_head_impl)->nVerticesFillCount;
  if ((sVar13 == 0) ||
     (puVar14 = ((this._M_head_impl)->vHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar14 != 0xffffffffffffffff)) {
    sVar11 = 0;
  }
  else {
    sVar11 = 0;
    do {
      if (sVar13 - 1 == sVar11) goto LAB_001e1c41;
      lVar9 = sVar11 + 1;
      sVar11 = sVar11 + 1;
    } while (puVar14[lVar9] == 0xffffffffffffffff);
  }
  if (sVar11 != sVar13) {
    do {
      pVVar6 = (((DATA_T *)((long)&(this_00._M_head_impl)->super_EmbeddedGeometryInterface + 0x1538)
                )->super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>)
               .m_storage.m_data;
      pVVar7 = (vertexPositions->
               super__Vector_base<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar6[sVar11].z = pVVar7[sVar11].z;
      pVVar7 = pVVar7 + sVar11;
      dVar8 = pVVar7->y;
      pVVar6 = pVVar6 + sVar11;
      pVVar6->x = pVVar7->x;
      pVVar6->y = dVar8;
      sVar15 = sVar11;
      do {
        if (sVar13 - 1 == sVar15) goto LAB_001e1c41;
        sVar11 = sVar15 + 1;
        lVar9 = sVar15 + 1;
        sVar15 = sVar11;
      } while (((this._M_head_impl)->vHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9] == 0xffffffffffffffff);
    } while (sVar13 != sVar11);
  }
LAB_001e1c41:
  this_01.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
  .
  super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
        )operator_new(0x40);
  MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>::MeshData
            ((MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2> *)
             this_01.
             super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
             .
             super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
             ._M_head_impl,this._M_head_impl);
  pvVar12 = (paramCoordinates->
            super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(paramCoordinates->
                super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12;
  sVar13 = (lVar9 >> 3) * -0x5555555555555555;
  if (sVar13 - (this._M_head_impl)->nFacesCount == 0 && lVar9 != 0) {
    uVar10 = 0;
    do {
      pVVar16 = pvVar12[uVar10].
                super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar12[uVar10].
                   super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                   ._M_impl.super__Vector_impl_data + 8) != pVVar16) {
        puVar14 = ((this._M_head_impl)->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar10;
        lVar9 = 0;
        uVar17 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pVVar16->x + lVar9);
          dVar8 = (double)puVar1[1];
          uVar5 = *puVar14;
          uVar17 = uVar17 + 1;
          lVar9 = lVar9 + 0x10;
          pVVar2 = (((DATA_T *)
                    ((long)this_01.
                           super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
                           .
                           super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
                           ._M_head_impl + 0x18))->
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>)
                   .m_storage.m_data + uVar5;
          pVVar2->x = (double)*puVar1;
          pVVar2->y = dVar8;
          pvVar12 = (paramCoordinates->
                    super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          puVar14 = ((this._M_head_impl)->heNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar5;
          pVVar16 = pvVar12[uVar10].
                    super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar17 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar12[uVar10].
                                                 super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                  (long)pVVar16 >> 4));
        sVar13 = (this._M_head_impl)->nFacesCount;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < sVar13);
  }
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Tuple_impl<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Tuple_impl<2UL,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Head_base<2UL,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
       = this_01.
         super___uniq_ptr_impl<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>
         .
         super__Head_base<0UL,_geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_*,_false>
         ._M_head_impl;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Tuple_impl<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  .
  super__Head_base<1UL,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>
  .super__Head_base<0UL,_geometrycentral::surface::VertexPositionGeometry_*,_false>._M_head_impl =
       this_00._M_head_impl;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_std::unique_ptr<geometrycentral::surface::VertexPositionGeometry,_std::default_delete<geometrycentral::surface::VertexPositionGeometry>_>,_std::unique_ptr<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>,_std::default_delete<geometrycentral::MeshData<geometrycentral::surface::Corner,_geometrycentral::Vector2>_>_>_>
  ).
  super__Head_base<0UL,_std::unique_ptr<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>,_false>
  ._M_head_impl._M_t.
  super___uniq_ptr_impl<geometrycentral::surface::SurfaceMesh,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  ._M_t.
  super__Tuple_impl<0UL,_geometrycentral::surface::SurfaceMesh_*,_std::default_delete<geometrycentral::surface::SurfaceMesh>_>
  .super__Head_base<0UL,_geometrycentral::surface::SurfaceMesh_*,_false>._M_head_impl =
       this._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<std::unique_ptr<SurfaceMesh>, std::unique_ptr<VertexPositionGeometry>, std::unique_ptr<CornerData<Vector2>>>
makeSurfaceMeshAndGeometry(const std::vector<std::vector<size_t>>& polygons,
                           const std::vector<std::vector<std::tuple<size_t, size_t>>>& twins,
                           const std::vector<Vector3> vertexPositions,
                           const std::vector<std::vector<Vector2>>& paramCoordinates) {

  // Construct
  std::unique_ptr<SurfaceMesh> mesh;
  if (twins.empty()) {
    mesh.reset(new SurfaceMesh(polygons));
  } else {
    mesh.reset(new SurfaceMesh(polygons, twins));
  }
  std::unique_ptr<VertexPositionGeometry> geometry(new VertexPositionGeometry(*mesh));
  for (Vertex v : mesh->vertices()) {
    // Use the low-level indexers here since we're constructing
    (*geometry).vertexPositions[v] = vertexPositions[v.getIndex()];
  }

  std::unique_ptr<CornerData<Vector2>> parameterization(new CornerData<Vector2>(*mesh));
  if (paramCoordinates.size() == mesh->nFaces()) {
    for (size_t i = 0; i < mesh->nFaces(); i++) {
      Halfedge h = mesh->face(i).halfedge();
      for (size_t j = 0; j < paramCoordinates[i].size(); j++) {
        (*parameterization)[h.corner()] = paramCoordinates[i][j];
        h = h.next();
      }
    }
  }

  return std::make_tuple(std::move(mesh), std::move(geometry), std::move(parameterization));
}